

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryBase.hpp
# Opt level: O2

void __thiscall
Diligent::EngineFactoryBase<Diligent::IEngineFactoryVk>::CreateDataBlob
          (EngineFactoryBase<Diligent::IEngineFactoryVk> *this,size_t InitialSize,void *pData,
          IDataBlob **ppDataBlob)

{
  IObject in_RAX;
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  IObject local_18;
  
  local_18._vptr_IObject = in_RAX._vptr_IObject;
  DataBlobImpl::Create((DataBlobImpl *)&stack0xffffffffffffffe8,InitialSize,pData);
  if (local_18._vptr_IObject != (_func_int **)0x0) {
    DataBlobImpl::QueryInterface
              ((DataBlobImpl *)local_18._vptr_IObject,(INTERFACE_ID *)IID_DataBlob,
               (IObject **)ppDataBlob);
  }
  RefCntAutoPtr<Diligent::DataBlobImpl>::Release
            ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

CreateDataBlob(size_t InitialSize, const void* pData, IDataBlob** ppDataBlob) const override final
    {
        if (auto pDataBlob = DataBlobImpl::Create(InitialSize, pData))
            pDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppDataBlob));
    }